

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_val_t * mpcaf_fold_regex(int n,mpc_val_t **xs)

{
  byte bVar1;
  mpc_val_t *x;
  char *__s;
  mpc_val_t *pmVar2;
  char *pcVar3;
  char *pcVar4;
  mpc_parser_t *pmVar5;
  mpc_parser_t *pmVar6;
  void *pvVar7;
  void *pvVar8;
  uint mode;
  
  x = *xs;
  __s = (char *)xs[1];
  pmVar2 = xs[2];
  pcVar3 = strchr(__s,0x6d);
  pcVar4 = strchr(__s,0x73);
  mode = (pcVar3 != (char *)0x0) + 2;
  if (pcVar4 == (char *)0x0) {
    mode = (uint)(pcVar3 != (char *)0x0);
  }
  pcVar3 = (char *)mpcf_unescape_new(x,"/",mpc_escape_output_raw_re);
  free(x);
  bVar1 = *(byte *)((long)pmVar2 + 0x18);
  pmVar5 = mpc_re_mode(pcVar3,mode);
  if ((bVar1 & 2) == 0) {
    pmVar6 = mpc_blank();
    pmVar5 = mpc_and(2,mpcf_fst,pmVar5,pmVar6,mpcf_dtor_null);
  }
  free(pcVar3);
  free(__s);
  pvVar7 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar7 + 0x30) = 0xf;
  *(mpc_parser_t **)((long)pvVar7 + 8) = pmVar5;
  *(code **)((long)pvVar7 + 0x10) = mpcf_str_ast;
  pvVar8 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar8 + 0x30) = 0x10;
  *(void **)((long)pvVar8 + 8) = pvVar7;
  *(code **)((long)pvVar8 + 0x10) = mpc_ast_tag;
  *(char **)((long)pvVar8 + 0x18) = "regex";
  pvVar7 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar7 + 0x30) = 7;
  pmVar5 = mpc_and(2,mpcf_state_ast,pvVar7,pvVar8,free);
  return pmVar5;
}

Assistant:

static mpc_val_t *mpcaf_fold_regex(int n, mpc_val_t **xs) {
  char *y = xs[0];
  char *m = xs[1];
  mpca_grammar_st_t *st = xs[2];
  mpc_parser_t *p;
  int mode = MPC_RE_DEFAULT;

  (void)n;
  if (strchr(m, 'm')) { mode |= MPC_RE_MULTILINE; }
  if (strchr(m, 's')) { mode |= MPC_RE_DOTALL; }
  y = mpcf_unescape_regex(y);
  p = (st->flags & MPCA_LANG_WHITESPACE_SENSITIVE) ? mpc_re_mode(y, mode) : mpc_tok(mpc_re_mode(y, mode));
  free(y);
  free(m);

  return mpca_state(mpca_tag(mpc_apply(p, mpcf_str_ast), "regex"));
}